

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionparser.cpp
# Opt level: O2

void __thiscall
OptionParser::parseReportItems
          (OptionParser *this,int nodeOrLink,Network *network,int nTokens,string *tokens)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  Node *pNVar4;
  InputError *pIVar5;
  char *__to;
  char *extraout_RDX;
  long lVar6;
  long lVar7;
  string *psVar8;
  string local_a0;
  string local_80;
  string local_60;
  int local_3c;
  int local_38;
  allocator local_32;
  byte local_31;
  
  local_31 = nodeOrLink == 1;
  local_3c = nTokens;
  local_38 = nodeOrLink;
  std::__cxx11::string::string((string *)&local_60,"NONE",&local_32);
  psVar8 = tokens + 1;
  bVar1 = Utilities::match(psVar8,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::string((string *)&local_60,"ALL",&local_32);
  bVar2 = Utilities::match(psVar8,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  __to = (char *)0x1;
  if (!bVar2) {
    __to = (char *)(ulong)((uint)!bVar1 * 2);
  }
  if ((int)__to == 2) {
    lVar6 = (long)local_3c;
    if (local_38 == 0) {
      psVar8 = tokens + 1;
      for (lVar7 = 1; lVar7 < lVar6; lVar7 = lVar7 + 1) {
        pNVar4 = Network::node(network,psVar8);
        if (pNVar4 == (Node *)0x0) {
          pIVar5 = (InputError *)__cxa_allocate_exception(0x30);
          std::__cxx11::string::string((string *)&local_a0,(string *)psVar8);
          InputError::InputError(pIVar5,5,&local_a0);
          __cxa_throw(pIVar5,&InputError::typeinfo,ENerror::~ENerror);
        }
        (pNVar4->super_Element).field_0x2c = 1;
        psVar8 = psVar8 + 1;
      }
    }
    else {
      for (lVar7 = 1; lVar7 < lVar6; lVar7 = lVar7 + 1) {
        iVar3 = Network::link(network,(char *)psVar8,__to);
        if (CONCAT44(extraout_var,iVar3) == 0) {
          pIVar5 = (InputError *)__cxa_allocate_exception(0x30);
          std::__cxx11::string::string((string *)&local_80,(string *)psVar8);
          InputError::InputError(pIVar5,5,&local_80);
          __cxa_throw(pIVar5,&InputError::typeinfo,ENerror::~ENerror);
        }
        *(undefined1 *)(CONCAT44(extraout_var,iVar3) + 0x2c) = 1;
        psVar8 = psVar8 + 1;
        __to = extraout_RDX;
      }
    }
  }
  else {
    Options::setOption(&network->options,local_31 + REPORT_NODES,(int)__to);
  }
  return;
}

Assistant:

void OptionParser::parseReportItems(int nodeOrLink, Network* network,
                                    int nTokens, string* tokens)
{
    // ... process NODES ALL/NONE & LINKS ALL/NONE options
    int value = Options::SOME;
    Options::IndexOption option = Options::REPORT_NODES;
    if ( nodeOrLink == Element::LINK ) option = Options::REPORT_LINKS;
    if ( Utilities::match(tokens[1], "NONE") ) value = Options::NONE;
    if ( Utilities::match(tokens[1], "ALL") )  value = Options::ALL;
    if ( value != Options::SOME )
    {
        network->options.setOption(option, value);
        return;
    }

    // ... process NODES  n1  n2  etc. option
    if ( nodeOrLink == Element::NODE )
    {
        for (int i = 1; i < nTokens; i++)
        {
            Node* node = network->node(tokens[i]);
            if ( node == nullptr )
            {
                throw InputError(InputError::UNDEFINED_OBJECT, tokens[i]);
            }
            node->rptFlag = true;
        }
    }

    // ... process LINKS l1  l2  etc. option
    else
    {
        for (int i = 1; i < nTokens; i++)
        {
            Link* link = network->link(tokens[i]);
            if ( link == nullptr )
            {
                throw InputError(InputError::UNDEFINED_OBJECT, tokens[i]);
            }
            link->rptFlag = true;
        }
    }
}